

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcDfs.c
# Opt level: O3

Gia_Man_t * Abc_NtkFunctionalIsoGia(Abc_Ntk_t *pNtk,int iCo1,int iCo2,int fCommon)

{
  uint uVar1;
  uint uVar2;
  char *pcVar3;
  int *piVar4;
  ulong uVar5;
  Gia_Obj_t *pGVar6;
  long *plVar7;
  uint uVar8;
  uint uVar9;
  Vec_Int_t *p;
  Vec_Int_t *p_00;
  Gia_Man_t *p_01;
  size_t sVar10;
  char *pcVar11;
  Vec_Int_t *p_02;
  int *piVar12;
  Abc_Obj_t *pAVar13;
  Gia_Obj_t *pGVar14;
  Gia_Man_t *pGVar15;
  int iVar16;
  int *piVar17;
  long lVar18;
  int *piVar19;
  int iVar20;
  int *piVar21;
  int i;
  int *piVar22;
  long lVar23;
  ulong uVar24;
  
  p = Abc_NtkNodeSupportInt(pNtk,iCo1);
  p_00 = Abc_NtkNodeSupportInt(pNtk,iCo2);
  uVar9 = p->nSize;
  if (uVar9 != p_00->nSize) {
    pGVar15 = (Gia_Man_t *)0x0;
    goto LAB_00847b40;
  }
  p_01 = Gia_ManStart(1000);
  pcVar3 = pNtk->pName;
  if (pcVar3 == (char *)0x0) {
    pcVar11 = (char *)0x0;
  }
  else {
    sVar10 = strlen(pcVar3);
    pcVar11 = (char *)malloc(sVar10 + 1);
    strcpy(pcVar11,pcVar3);
  }
  p_01->pName = pcVar11;
  pcVar3 = pNtk->pSpec;
  if (pcVar3 == (char *)0x0) {
    pcVar11 = (char *)0x0;
  }
  else {
    sVar10 = strlen(pcVar3);
    pcVar11 = (char *)malloc(sVar10 + 1);
    strcpy(pcVar11,pcVar3);
  }
  p_01->pSpec = pcVar11;
  Gia_ManHashStart(p_01);
  if (fCommon != 0) {
    p_02 = (Vec_Int_t *)malloc(0x10);
    uVar8 = 0x10;
    if (0xe < uVar9 - 1) {
      uVar8 = uVar9;
    }
    p_02->nCap = uVar8;
    if (uVar8 == 0) {
      piVar12 = (int *)0x0;
    }
    else {
      piVar12 = (int *)malloc((long)(int)uVar8 << 2);
    }
    p_02->pArray = piVar12;
    piVar12 = p->pArray;
    piVar4 = p_00->pArray;
    p_02->nSize = 0;
    piVar17 = piVar12;
    piVar19 = piVar4;
    piVar21 = piVar4;
    piVar22 = piVar12;
    if (0 < (int)uVar9) {
      do {
        iVar20 = *piVar17;
        iVar16 = *piVar19;
        if (iVar20 == iVar16) {
          Vec_IntPush(p_02,iVar20);
          piVar17 = piVar17 + 1;
          piVar19 = piVar19 + 1;
        }
        else if (iVar20 < iVar16) {
          piVar17 = piVar17 + 1;
          *piVar22 = iVar20;
          piVar22 = piVar22 + 1;
        }
        else {
          piVar19 = piVar19 + 1;
          *piVar21 = iVar16;
          piVar21 = piVar21 + 1;
        }
      } while ((piVar17 < piVar12 + (int)uVar9) && (piVar19 < piVar4 + (int)uVar9));
    }
    for (; piVar17 < piVar12 + (int)uVar9; piVar17 = piVar17 + 1) {
      *piVar22 = *piVar17;
      piVar22 = piVar22 + 1;
    }
    for (; piVar19 < piVar4 + (int)uVar9; piVar19 = piVar19 + 1) {
      *piVar21 = *piVar19;
      piVar21 = piVar21 + 1;
    }
    iVar20 = (int)((ulong)((long)piVar22 - (long)piVar12) >> 2);
    if (p->nSize < iVar20) {
LAB_00847c57:
      __assert_fail("p->nSize >= nSizeNew",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                    ,0x2b7,"void Vec_IntShrink(Vec_Int_t *, int)");
    }
    p->nSize = iVar20;
    iVar20 = (int)((ulong)((long)piVar21 - (long)piVar4) >> 2);
    if (p_00->nSize < iVar20) goto LAB_00847c57;
    p_00->nSize = iVar20;
    lVar18 = (long)p_02->nSize;
    piVar12 = p_02->pArray;
    if (lVar18 < 1) {
      if (piVar12 != (int *)0x0) goto LAB_0084773f;
    }
    else {
      lVar23 = 0;
      do {
        Vec_IntPush(p,piVar12[lVar23]);
        lVar23 = lVar23 + 1;
      } while (lVar18 != lVar23);
      lVar23 = 0;
      do {
        Vec_IntPush(p_00,piVar12[lVar23]);
        lVar23 = lVar23 + 1;
      } while (lVar18 != lVar23);
LAB_0084773f:
      free(piVar12);
    }
    free(p_02);
    uVar9 = p->nSize;
    if (uVar9 != p_00->nSize) {
      __assert_fail("Vec_IntSize(vSupp1) == Vec_IntSize(vSupp2)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/abc/abcDfs.c"
                    ,0x3ec,"Gia_Man_t *Abc_NtkFunctionalIsoGia(Abc_Ntk_t *, int, int, int)");
    }
  }
  pAVar13 = Abc_AigConst1(pNtk);
  (pAVar13->field_6).iTemp = 1;
  if (0 < (int)uVar9) {
    piVar12 = p->pArray;
    uVar24 = 0;
    do {
      uVar8 = piVar12[uVar24];
      pGVar14 = Gia_ManAppendObj(p_01);
      uVar5 = *(ulong *)pGVar14;
      *(ulong *)pGVar14 = uVar5 | 0x9fffffff;
      *(ulong *)pGVar14 =
           uVar5 & 0xe0000000ffffffff | 0x9fffffff | (ulong)(p_01->vCis->nSize & 0x1fffffff) << 0x20
      ;
      pGVar6 = p_01->pObjs;
      if ((pGVar14 < pGVar6) || (pGVar6 + p_01->nObjs <= pGVar14)) goto LAB_00847b7e;
      Vec_IntPush(p_01->vCis,(int)((ulong)((long)pGVar14 - (long)pGVar6) >> 2) * -0x55555555);
      pGVar6 = p_01->pObjs;
      if ((pGVar14 < pGVar6) || (pGVar6 + p_01->nObjs <= pGVar14)) goto LAB_00847b7e;
      if (((int)uVar8 < 0) || (pNtk->vCis->nSize <= (int)uVar8)) goto LAB_00847b9d;
      *(int *)((long)pNtk->vCis->pArray[uVar8] + 0x40) =
           (int)((ulong)((long)pGVar14 - (long)pGVar6) >> 2) * 0x55555556;
      uVar24 = uVar24 + 1;
    } while (uVar9 != uVar24);
  }
  if ((pNtk->vTravIds).pArray == (int *)0x0) {
    iVar20 = pNtk->vObjs->nSize;
    uVar24 = (long)iVar20 + 500;
    iVar16 = (int)uVar24;
    if ((pNtk->vTravIds).nCap < iVar16) {
      piVar12 = (int *)malloc(uVar24 * 4);
      (pNtk->vTravIds).pArray = piVar12;
      if (piVar12 == (int *)0x0) goto LAB_00847c95;
      (pNtk->vTravIds).nCap = iVar16;
    }
    else {
      piVar12 = (int *)0x0;
    }
    if (-500 < iVar20) {
      memset(piVar12,0,(uVar24 & 0xffffffff) << 2);
    }
    (pNtk->vTravIds).nSize = iVar16;
  }
  iVar20 = pNtk->nTravIds;
  pNtk->nTravIds = iVar20 + 1;
  if (0x3ffffffe < iVar20) {
LAB_00847c19:
    __assert_fail("p->nTravIds < (1<<30)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/abc/abc.h"
                  ,0x198,"void Abc_NtkIncrementTravId(Abc_Ntk_t *)");
  }
  if ((iCo1 < 0) || (pNtk->vCos->nSize <= iCo1)) {
LAB_00847b9d:
    __assert_fail("i >= 0 && i < p->nSize",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecPtr.h"
                  ,0x184,"void *Vec_PtrEntry(Vec_Ptr_t *, int)");
  }
  plVar7 = (long *)pNtk->vCos->pArray[(uint)iCo1];
  uVar8 = Abc_NtkFunctionalIsoGia_rec
                    (p_01,*(Abc_Obj_t **)
                           (*(long *)(*(long *)(*plVar7 + 0x20) + 8) + (long)*(int *)plVar7[4] * 8))
  ;
  if (-1 < (int)uVar8) {
    uVar1 = *(uint *)((long)plVar7 + 0x14);
    if (0 < (int)uVar9) {
      piVar12 = p_00->pArray;
      uVar24 = 0;
      do {
        if ((long)p_01->vCis->nSize <= (long)uVar24) {
          __assert_fail("i >= 0 && i < p->nSize",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                        ,0x1a9,"int Vec_IntEntry(Vec_Int_t *, int)");
        }
        iVar20 = p_01->vCis->pArray[uVar24];
        if (((long)iVar20 < 0) || (p_01->nObjs <= iVar20)) {
          __assert_fail("v >= 0 && v < p->nObjs",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/gia.h"
                        ,0x1d1,"Gia_Obj_t *Gia_ManObj(Gia_Man_t *, int)");
        }
        pGVar6 = p_01->pObjs;
        pGVar14 = (Gia_Obj_t *)((ulong)(pGVar6 + iVar20) & 0xfffffffffffffffe);
        if ((pGVar14 < pGVar6) || (pGVar6 + (uint)p_01->nObjs <= pGVar14)) {
LAB_00847b7e:
          __assert_fail("p->pObjs <= pObj && pObj < p->pObjs + p->nObjs",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/gia.h"
                        ,0x1d9,"int Gia_ObjId(Gia_Man_t *, Gia_Obj_t *)");
        }
        iVar16 = (int)((ulong)((long)pGVar14 - (long)pGVar6) >> 2);
        if (iVar16 * -0x55555555 < 0) {
          __assert_fail("Var >= 0 && !(c >> 1)",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/util/abc_global.h"
                        ,0x12e,"int Abc_Var2Lit(int, int)");
        }
        uVar2 = piVar12[uVar24];
        if (((int)uVar2 < 0) || (pNtk->vCis->nSize <= (int)uVar2)) goto LAB_00847b9d;
        *(uint *)((long)pNtk->vCis->pArray[uVar2] + 0x40) =
             ((uint)(pGVar6 + iVar20) & 1) + iVar16 * 0x55555556;
        uVar24 = uVar24 + 1;
      } while (uVar9 != uVar24);
    }
    if ((pNtk->vTravIds).pArray == (int *)0x0) {
      iVar20 = pNtk->vObjs->nSize;
      uVar24 = (long)iVar20 + 500;
      iVar16 = (int)uVar24;
      if ((pNtk->vTravIds).nCap < iVar16) {
        piVar12 = (int *)malloc(uVar24 * 4);
        (pNtk->vTravIds).pArray = piVar12;
        if (piVar12 == (int *)0x0) {
LAB_00847c95:
          __assert_fail("p->pArray",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                        ,0x217,"void Vec_IntGrow(Vec_Int_t *, int)");
        }
        (pNtk->vTravIds).nCap = iVar16;
      }
      else {
        piVar12 = (int *)0x0;
      }
      if (-500 < iVar20) {
        memset(piVar12,0,(uVar24 & 0xffffffff) << 2);
      }
      (pNtk->vTravIds).nSize = iVar16;
    }
    iVar20 = pNtk->nTravIds;
    pNtk->nTravIds = iVar20 + 1;
    if (0x3ffffffe < iVar20) goto LAB_00847c19;
    if ((iCo2 < 0) || (pNtk->vCos->nSize <= iCo2)) goto LAB_00847b9d;
    plVar7 = (long *)pNtk->vCos->pArray[(uint)iCo2];
    uVar9 = Abc_NtkFunctionalIsoGia_rec
                      (p_01,*(Abc_Obj_t **)
                             (*(long *)(*(long *)(*plVar7 + 0x20) + 8) + (long)*(int *)plVar7[4] * 8
                             ));
    if (-1 < (int)uVar9) {
      uVar2 = *(uint *)((long)plVar7 + 0x14);
      Gia_ManAppendCo(p_01,uVar1 >> 10 & 1 ^ uVar8);
      Gia_ManAppendCo(p_01,uVar2 >> 10 & 1 ^ uVar9);
      pGVar15 = Gia_ManCleanup(p_01);
      Gia_ManStop(p_01);
LAB_00847b40:
      if (p->pArray != (int *)0x0) {
        free(p->pArray);
      }
      free(p);
      if (p_00->pArray != (int *)0x0) {
        free(p_00->pArray);
      }
      free(p_00);
      return pGVar15;
    }
  }
  __assert_fail("Lit >= 0",
                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/util/abc_global.h"
                ,0x132,"int Abc_LitNotCond(int, int)");
}

Assistant:

Gia_Man_t * Abc_NtkFunctionalIsoGia( Abc_Ntk_t * pNtk, int iCo1, int iCo2, int fCommon )
{
    Gia_Man_t * pNew = NULL, * pTemp;
    Vec_Int_t * vSupp1 = Abc_NtkNodeSupportInt( pNtk, iCo1 );
    Vec_Int_t * vSupp2 = Abc_NtkNodeSupportInt( pNtk, iCo2 );
    if ( Vec_IntSize(vSupp1) == Vec_IntSize(vSupp2) )
    {
        Abc_Obj_t * pObj;
        int i, iCi, iLit1, iLit2;
        pNew = Gia_ManStart( 1000 );
        pNew->pName = Abc_UtilStrsav( pNtk->pName );
        pNew->pSpec = Abc_UtilStrsav( pNtk->pSpec );
        Gia_ManHashStart( pNew );
        // put commom together
        if ( fCommon )
        {
            Vec_Int_t * vCommon = Vec_IntAlloc( Vec_IntSize(vSupp1) );
            Vec_IntTwoRemoveCommon( vSupp1, vSupp2, vCommon );
            Vec_IntAppend( vSupp1, vCommon );
            Vec_IntAppend( vSupp2, vCommon );
            Vec_IntFree( vCommon );
            assert( Vec_IntSize(vSupp1) == Vec_IntSize(vSupp2) );            
        }
        // primary inputs
        Abc_AigConst1(pNtk)->iTemp = 1;
        Vec_IntForEachEntry( vSupp1, iCi, i )
            Abc_NtkCi(pNtk, iCi)->iTemp = Gia_ManAppendCi(pNew);
        // create the first cone
        Abc_NtkIncrementTravId( pNtk );
        pObj = Abc_NtkCo( pNtk, iCo1 );
        iLit1 = Abc_NtkFunctionalIsoGia_rec( pNew, Abc_ObjFanin0(pObj) );
        iLit1 = Abc_LitNotCond( iLit1, Abc_ObjFaninC0(pObj) );
        // primary inputs
        Vec_IntForEachEntry( vSupp2, iCi, i )
            Abc_NtkCi(pNtk, iCi)->iTemp = Gia_ManCiLit(pNew, i);
        // create the second cone
        Abc_NtkIncrementTravId( pNtk );
        pObj = Abc_NtkCo( pNtk, iCo2 );
        iLit2 = Abc_NtkFunctionalIsoGia_rec( pNew, Abc_ObjFanin0(pObj) );
        iLit2 = Abc_LitNotCond( iLit2, Abc_ObjFaninC0(pObj) );
        Gia_ManAppendCo( pNew, iLit1 );
        Gia_ManAppendCo( pNew, iLit2 );
        // perform cleanup
        pNew = Gia_ManCleanup( pTemp = pNew );
        Gia_ManStop( pTemp );
    }
    Vec_IntFree( vSupp1 );
    Vec_IntFree( vSupp2 );
    return pNew;
}